

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_texture_load_instruction(Impl *impl,CallInst *instruction)

{
  mapped_type *pmVar1;
  uint count;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ComponentType element_type;
  Id IVar5;
  Id IVar6;
  Op OVar7;
  Builder *pBVar8;
  Value *pVVar9;
  mapped_type *pmVar10;
  Type *pTVar11;
  Operation *pOVar12;
  uint i_1;
  Op op;
  uint i;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 in_stack_ffffffffffffff48;
  uint32_t local_b0;
  uint local_ac;
  Id local_a8;
  Id image_id;
  Id local_a0;
  uint num_coords;
  ulong local_98;
  Operation *local_90;
  mapped_type *local_88;
  Id local_80;
  Id local_7c;
  Id coord [3];
  Id offsets [4];
  uint num_coords_full;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_48;
  
  bVar2 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  bVar3 = true;
  if (bVar2) {
    pBVar8 = Converter::Impl::builder(impl);
    pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar6 = 0;
    image_id = Converter::Impl::get_id_for_value(impl,pVVar9,0);
    IVar5 = Converter::Impl::get_type_id(impl,image_id);
    local_88 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->handle_to_resource_meta,&image_id);
    bVar2 = spv::Builder::isStorageImageType(pBVar8,IVar5);
    local_b0 = 0;
    pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    bVar3 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar9);
    if (!bVar3) {
      pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
      bVar3 = spv::Builder::isMultisampledImageType(pBVar8,IVar5);
      if (bVar3) {
        local_b0 = 0x40;
      }
      else {
        local_b0 = 2;
      }
    }
    coord[2] = 0;
    coord[0] = 0;
    coord[1] = 0;
    num_coords_full = 0;
    num_coords = 0;
    bVar4 = get_image_dimensions(impl,image_id,&num_coords_full,&num_coords);
    count = num_coords_full;
    bVar3 = num_coords_full < 4 && bVar4;
    if (num_coords_full < 4 && bVar4) {
      uVar15 = (ulong)num_coords_full;
      local_a8 = IVar6;
      for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar14 + 3);
        IVar5 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
        coord[uVar14] = IVar5;
      }
      offsets[0] = 0;
      offsets[1] = 0;
      offsets[2] = 0;
      offsets[3] = 0;
      local_98 = (ulong)num_coords;
      get_texel_offsets(impl,instruction,&local_b0,6,num_coords,offsets,
                        (bool)in_stack_ffffffffffffff48);
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)instruction;
      pmVar10 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_composite_meta,(key_type *)&local_48);
      local_ac = pmVar10->access_mask;
      if ((local_ac & 0x10) != 0) {
        spv::Builder::addCapability(pBVar8,CapabilitySparseResidency);
      }
      element_type = Converter::Impl::get_effective_typed_resource_type(local_88->component_type);
      IVar5 = Converter::Impl::get_type_id(impl,element_type,1,4,false);
      if ((local_ac & 0x10) == 0) {
        OVar7 = OpImageRead;
        op = OpImageFetch;
      }
      else {
        local_80 = spv::Builder::makeUintType(pBVar8,0x20);
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_7c = IVar5;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_range_initialize<unsigned_int_const*>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
                   &local_80);
        IVar5 = Converter::Impl::get_struct_type(impl,(Vector<spv::Id> *)&local_48,0,"SparseTexel");
        std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
        ~_Vector_base(&local_48);
        OVar7 = OpImageSparseRead;
        op = OpImageSparseFetch;
      }
      if (bVar2) {
        op = OVar7;
      }
      local_90 = Converter::Impl::allocate(impl,op,(Value *)instruction,IVar5);
      if ((local_ac & 0x10) == 0) {
        pTVar11 = LLVMBC::Value::getType((Value *)instruction);
        pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar11,local_90->id,true);
      }
      IVar5 = spv::Builder::makeUintType(pBVar8,0x20);
      IVar5 = Converter::Impl::build_vector(impl,IVar5,coord,count);
      uVar13 = local_b0;
      uVar14 = local_98;
      if ((local_b0 & 0x10) != 0 && !bVar2) {
        for (; local_a0 = IVar5, uVar14 < uVar15; uVar14 = uVar14 + 1) {
          IVar5 = spv::Builder::makeIntConstant(pBVar8,0,false);
          offsets[uVar14] = IVar5;
          IVar5 = local_a0;
        }
        IVar5 = spv::Builder::makeIntType(pBVar8,0x20);
        IVar5 = Converter::Impl::build_vector_type(impl,IVar5,count);
        pOVar12 = Converter::Impl::allocate(impl,OpIAdd,IVar5);
        Operation::add_id(pOVar12,local_a0);
        IVar5 = build_texel_offset_vector(impl,offsets,count,uVar13,false);
        Operation::add_id(pOVar12,IVar5);
        Converter::Impl::add(impl,pOVar12,false);
        IVar5 = pOVar12->id;
        uVar13 = uVar13 & 0xffffffef;
      }
      pOVar12 = local_90;
      local_48._M_impl.super__Vector_impl_data._M_start = &local_80;
      local_80 = image_id;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      local_7c = IVar5;
      Operation::add_ids(local_90,(initializer_list<unsigned_int> *)&local_48);
      Operation::add_literal(pOVar12,uVar13);
      if (!bVar2) {
        if ((uVar13 & 2) != 0) {
          Operation::add_id(pOVar12,local_a8);
        }
        if ((uVar13 & 8) != 0) {
          IVar5 = build_texel_offset_vector(impl,offsets,(uint)local_98,uVar13,false);
          Operation::add_id(pOVar12,IVar5);
        }
      }
      if (((uVar13 & 0x40) != 0) && (Operation::add_id(pOVar12,local_a8), bVar2)) {
        pBVar8 = Converter::Impl::builder(impl);
        spv::Builder::addCapability(pBVar8,CapabilityStorageImageMultisample);
      }
      pmVar1 = local_88;
      Converter::Impl::add(impl,pOVar12,local_88->rov);
      pTVar11 = LLVMBC::Value::getType((Value *)instruction);
      pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
      if ((local_ac & 0x10) == 0) {
        Converter::Impl::fixup_load_type_typed
                  (impl,pmVar1->component_type,4,(Value *)instruction,pTVar11);
        build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
      }
      else {
        Converter::Impl::repack_sparse_feedback
                  (impl,pmVar1->component_type,4,(Value *)instruction,pTVar11,0);
      }
    }
  }
  return bVar3;
}

Assistant:

bool emit_texture_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	bool is_uav = builder.isStorageImageType(image_type_id);
	uint32_t image_ops = 0;

	spv::Id mip_or_sample = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(2)))
	{
		mip_or_sample = impl.get_id_for_value(instruction->getOperand(2));
		if (builder.isMultisampledImageType(image_type_id))
			image_ops |= spv::ImageOperandsSampleMask;
		else
			image_ops |= spv::ImageOperandsLodMask;
	}

	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[4] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 6, num_coords, offsets, false))
		return false;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Op opcode;
	if (is_uav)
		opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
	else
		opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	spv::Id coord_id = impl.build_vector(builder.makeUintType(32), coord, num_coords_full);
	if (!is_uav && (image_ops & spv::ImageOperandsOffsetMask))
	{
		// Don't need fancy features for fetch, just do arith.
		for (unsigned i = num_coords; i < num_coords_full; i++)
			offsets[i] = builder.makeIntConstant(0);
		auto *add_op = impl.allocate(spv::OpIAdd, impl.build_vector_type(builder.makeIntType(32), num_coords_full));
		add_op->add_id(coord_id);
		add_op->add_id(build_texel_offset_vector(impl, offsets, num_coords_full, image_ops, false));
		impl.add(add_op);
		coord_id = add_op->id;
		image_ops &= ~spv::ImageOperandsOffsetMask;
	}

	op->add_ids({ image_id, coord_id });
	op->add_literal(image_ops);

	if (!is_uav)
	{
		if (image_ops & spv::ImageOperandsLodMask)
			op->add_id(mip_or_sample);

		if (image_ops & spv::ImageOperandsConstOffsetMask)
			op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));
	}

	if (image_ops & spv::ImageOperandsSampleMask)
	{
		op->add_id(mip_or_sample);
		if (is_uav)
			impl.builder().addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}